

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

Color * __thiscall
Scene::trace(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Ray *ray)

{
  Ray *weight_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  double dVar4;
  Vector local_a0;
  Vector local_88;
  Vector local_70;
  Color local_58;
  double local_40;
  double t;
  GeometricObject *obj;
  Ray *ray_local;
  double weight_local;
  Medium *curMed_local;
  Scene *this_local;
  Color *color;
  
  local_40 = 30000.0;
  obj = (GeometricObject *)ray;
  ray_local = (Ray *)weight;
  weight_local = (double)curMed;
  curMed_local = (Medium *)this;
  this_local = (Scene *)__return_storage_ptr__;
  Vector::Vector(__return_storage_ptr__);
  level = level + 1;
  Stats::raysCast();
  iVar2 = (*this->_vptr_Scene[2])(this,obj,&local_40);
  dVar4 = weight_local;
  weight_00 = ray_local;
  t = (double)CONCAT44(extraout_var,iVar2);
  if (t == 0.0) {
    (*this->_vptr_Scene[3])(&local_a0,this,obj);
    Vector::operator=(__return_storage_ptr__,&local_a0);
  }
  else {
    Ray::point(&local_70,(Ray *)obj,local_40);
    Vector::Vector(&local_88,(Vector *)&(obj->def_material).ks);
    shade(&local_58,this,(Medium *)dVar4,(double)weight_00,&local_70,&local_88,(GeometricObject *)t)
    ;
    Vector::operator=(__return_storage_ptr__,&local_58);
    if (threshold < *(double *)((long)weight_local + 8)) {
      dVar4 = exp(-local_40 * *(double *)((long)weight_local + 8));
      Vector::operator*=(__return_storage_ptr__,dVar4);
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->envFog);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Fog,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Fog,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->envFog);
    (**peVar3->_vptr_Fog)(local_40,peVar3,__return_storage_ptr__);
  }
  level = level + -1;
  return __return_storage_ptr__;
}

Assistant:

Color Scene::trace(Grayzer::Medium& curMed, double weight, Ray& ray)
{
   GeometricObject *obj;
   double t = GEOM_INFINITY;
   Color color;

   level++;
   Stats::raysCast();

   if((obj = intersect(ray,t)) != 0)
   {
      color = shade(curMed, weight, ray.point(t), ray.dir, obj);
      if(curMed.beta > threshold) color *= exp(-t * curMed.beta);
   }
   else
      color = shade_background(ray);
   //
   // added fog
   //
   if (envFog) envFog->shade(color, t);

   level--;
   return color;
}